

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

Var __thiscall Minisat::OnlineProofChecker::newVar(OnlineProofChecker *this)

{
  long in_RDI;
  int v;
  value_type *in_stack_ffffffffffffff48;
  vec<Minisat::lbool> *in_stack_ffffffffffffff50;
  uint32_t newSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  MarkArray *this_00;
  MarkArray local_68;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  lbool local_15;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = nVars((OnlineProofChecker *)0x14f081);
  local_10 = (int)mkLit(local_c,false);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x58),(EVP_PKEY_CTX *)&local_10);
  local_14 = (int)mkLit(local_c,true);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             (in_RDI + 0x58),(EVP_PKEY_CTX *)&local_14);
  lbool::lbool(&local_15,'\x02');
  vec<Minisat::lbool>::push(in_stack_ffffffffffffff50,(lbool *)in_stack_ffffffffffffff48);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x14f156);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff60);
  newSize = (uint32_t)((ulong)(in_RDI + 0x40) >> 0x20);
  local_68.array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &local_68;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x14f1a2);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this_00->array);
  MarkArray::size((MarkArray *)0x14f1dc);
  MarkArray::resize(this_00,newSize);
  vec<Minisat::Lit>::capacity((vec<Minisat::Lit> *)this_00,newSize);
  return local_c;
}

Assistant:

inline Var OnlineProofChecker::newVar()
{
    int v = nVars();
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));

    assigns.push(l_Undef);
    occ.push_back(std::vector<CRef>()); // there are no new clauses here yet
    occ.push_back(std::vector<CRef>());
    ma.resize(ma.size() + 2); // for each literal have a cell
    trail.capacity(v + 1);
    return v;
}